

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

SPIRType * __thiscall
spirv_cross::Compiler::get_variable_element_type(Compiler *this,SPIRVariable *var)

{
  bool bVar1;
  uint32_t id;
  SPIRType *local_20;
  SPIRType *type;
  SPIRVariable *var_local;
  Compiler *this_local;
  
  local_20 = get_variable_data_type(this,var);
  bVar1 = is_array(this,local_20);
  if (bVar1) {
    id = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_20->parent_type);
    local_20 = get<spirv_cross::SPIRType>(this,id);
  }
  return local_20;
}

Assistant:

const SPIRType &Compiler::get_variable_element_type(const SPIRVariable &var) const
{
	const SPIRType *type = &get_variable_data_type(var);
	if (is_array(*type))
		type = &get<SPIRType>(type->parent_type);
	return *type;
}